

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_libapi.cpp
# Opt level: O0

ze_result_t zesSchedulerSetExclusiveMode(zes_sched_handle_t hScheduler,ze_bool_t *pNeedReload)

{
  zes_pfnSchedulerSetExclusiveMode_t p_Var1;
  __pointer_type p_Var2;
  zes_pfnSchedulerSetExclusiveMode_t pfnSetExclusiveMode;
  ze_bool_t *pNeedReload_local;
  zes_sched_handle_t hScheduler_local;
  
  if ((ze_lib::destruction & 1) == 0) {
    p_Var2 = std::atomic<_zes_dditable_t_*>::load
                       ((atomic<_zes_dditable_t_*> *)(ze_lib::context + 0x20),memory_order_seq_cst);
    p_Var1 = (p_Var2->Scheduler).pfnSetExclusiveMode;
    if (p_Var1 == (zes_pfnSchedulerSetExclusiveMode_t)0x0) {
      if ((*(byte *)(ze_lib::context + 0xd90) & 1) == 0) {
        hScheduler_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
      }
      else {
        hScheduler_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
      }
    }
    else {
      hScheduler_local._4_4_ = (*p_Var1)(hScheduler,pNeedReload);
    }
  }
  else {
    hScheduler_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  return hScheduler_local._4_4_;
}

Assistant:

ze_result_t ZE_APICALL
zesSchedulerSetExclusiveMode(
    zes_sched_handle_t hScheduler,                  ///< [in] Sysman handle for the component.
    ze_bool_t* pNeedReload                          ///< [in,out] Will be set to TRUE if a device driver reload is needed to
                                                    ///< apply the new scheduler mode.
    )
{
    #ifdef DYNAMIC_LOAD_LOADER
    ze_result_t result = ZE_RESULT_SUCCESS;
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }
    static const zes_pfnSchedulerSetExclusiveMode_t pfnSetExclusiveMode = [&result] {
        auto pfnSetExclusiveMode = ze_lib::context->zesDdiTable.load()->Scheduler.pfnSetExclusiveMode;
        if( nullptr == pfnSetExclusiveMode ) {
            result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
        }
        return pfnSetExclusiveMode;
    }();
    if (result != ZE_RESULT_SUCCESS) {
        return result;
    }
    return pfnSetExclusiveMode( hScheduler, pNeedReload );
    #else
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    auto pfnSetExclusiveMode = ze_lib::context->zesDdiTable.load()->Scheduler.pfnSetExclusiveMode;
    if( nullptr == pfnSetExclusiveMode ) {
        if(!ze_lib::context->isInitialized)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        else
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
    }

    return pfnSetExclusiveMode( hScheduler, pNeedReload );
    #endif
}